

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecutionStatus.h
# Opt level: O0

void __thiscall cmExecutionStatus::~cmExecutionStatus(cmExecutionStatus *this)

{
  cmExecutionStatus *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Variables);
  std::__cxx11::string::~string((string *)&this->Error);
  return;
}

Assistant:

cmExecutionStatus(cmMakefile& makefile)
    : Makefile(makefile)
    , Error("unknown error.")
  {
  }